

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.h
# Opt level: O1

Matrix<Rational> __thiscall Matrix<Rational>::operator/(Matrix<Rational> *this,Rational *a)

{
  Matrix<Rational> *a_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDX;
  Rational *extraout_RDX;
  Matrix<Rational> MVar1;
  Matrix<Rational> temp;
  Matrix<Rational> local_60;
  Rational local_50;
  
  Matrix(&local_60,(Matrix<Rational> *)a);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_50,in_RDX);
  local_50._numerator.negative =
       *(bool *)&in_RDX[1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_50._denominator.digits,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &in_RDX[1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish);
  local_50._denominator.negative =
       *(bool *)&in_RDX[2].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
  a_00 = operator/=(&local_60,&local_50);
  Matrix(this,a_00);
  if (local_50._denominator.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50._denominator.digits.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_50._numerator.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50._numerator.digits.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  ~Matrix(&local_60);
  MVar1.arr = extraout_RDX;
  MVar1._0_8_ = this;
  return MVar1;
}

Assistant:

inline const Matrix operator/(Field a) const
    {
        Matrix temp(*this);
        return temp /= a;
    }